

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O0

int poptReadConfigFile(poptContext con,char *fn)

{
  int *piVar1;
  ushort **ppuVar2;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  int local_58;
  int local_54;
  byte *pbStack_50;
  int rc;
  char *te;
  char *t;
  char *se;
  size_t nb;
  char *be;
  char *b;
  char *fn_local;
  poptContext con_local;
  
  be = (char *)0x0;
  se = (char *)0x0;
  te = (char *)0x0;
  b = fn;
  fn_local = (char *)con;
  local_58 = poptReadFile(fn,&be,(size_t *)&se,1);
  if (local_58 == 0) {
    if ((be == (char *)0x0) || (se == (char *)0x0)) {
      local_54 = -0x16;
    }
    else {
      te = (char *)malloc((size_t)(se + 1));
      local_54 = local_58;
      if ((byte *)te != (byte *)0x0) {
        nb = (size_t)(be + (long)se);
        pbStack_50 = (byte *)te;
        for (t = be; t < nb; t = t + 1) {
          if (*t == '\n') {
            *pbStack_50 = 0;
            pbStack_50 = (byte *)te;
            while( true ) {
              bVar5 = false;
              if (*pbStack_50 != 0) {
                ppuVar2 = __ctype_b_loc();
                bVar5 = ((*ppuVar2)[(int)(uint)*pbStack_50] & 0x2000) != 0;
              }
              if (!bVar5) break;
              pbStack_50 = pbStack_50 + 1;
            }
            if (((*pbStack_50 != 0) && (*pbStack_50 != 0x23)) &&
               (local_54 = poptConfigLine((poptContext)fn_local,(char *)pbStack_50), local_54 != 0))
            goto LAB_001078ee;
          }
          else if (*t == '\\') {
            pbVar4 = (byte *)(t + 1);
            *pbStack_50 = *t;
            t = (char *)pbVar4;
            if ((pbVar4 < nb) && (*pbVar4 != 10)) {
              pbVar3 = pbStack_50 + 1;
              pbStack_50 = pbStack_50 + 2;
              *pbVar3 = *pbVar4;
            }
          }
          else {
            *pbStack_50 = *t;
            pbStack_50 = pbStack_50 + 1;
          }
        }
        local_54 = 0;
      }
    }
LAB_001078ee:
    free(te);
    if (be != (char *)0x0) {
      free(be);
    }
    con_local._4_4_ = local_54;
  }
  else {
    piVar1 = __errno_location();
    if (*piVar1 == 2) {
      local_58 = 0;
    }
    con_local._4_4_ = local_58;
  }
  return con_local._4_4_;
}

Assistant:

int poptReadConfigFile(poptContext con, const char * fn)
{
    char * b = NULL, *be;
    size_t nb = 0;
    const char *se;
    char *t = NULL, *te;
    int rc;

    if ((rc = poptReadFile(fn, &b, &nb, POPT_READFILE_TRIMNEWLINES)) != 0)
	return (errno == ENOENT ? 0 : rc);
    if (b == NULL || nb == 0) {
	rc = POPT_ERROR_BADCONFIG;
	goto exit;
    }

    if ((t = malloc(nb + 1)) == NULL)
	goto exit;
    te = t;

    be = (b + nb);
    for (se = b; se < be; se++) {
	switch (*se) {
	  case '\n':
	    *te = '\0';
	    te = t;
	    while (*te && _isspaceptr(te)) te++;
	    if (*te && *te != '#')
		if ((rc = poptConfigLine(con, te)) != 0)
		    goto exit;
	    break;
	  case '\\':
	    *te = *se++;
	    /* \ at the end of a line does not insert a \n */
	    if (se < be && *se != '\n') {
		te++;
		*te++ = *se;
	    }
	    break;
	  default:
	    *te++ = *se;
	    break;
	}
    }
    rc = 0;

exit:
    free(t);
    if (b)
	free(b);
    return rc;
}